

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O2

int cram_index_load(cram_fd *fd,char *fn)

{
  char cVar1;
  cram_index *pcVar2;
  uint uVar3;
  cram_fd *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  hFILE *fp;
  ssize_t sVar9;
  char *pcVar10;
  cram_index *pcVar11;
  undefined8 *puVar12;
  byte *pbVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  size_t __n;
  int iVar19;
  undefined8 *puStack_110b8;
  size_t sStack_110b0;
  kstring_t kstr;
  cram_index *pcStack_11088;
  size_t l;
  undefined8 uStack_11070;
  uint uStack_11068;
  int iStack_11064;
  int iStack_11060;
  undefined4 uStack_1105c;
  undefined8 uStack_11058;
  long lStack_11050;
  long lStack_11048;
  cram_fd *pcStack_11040;
  char fn2 [4096];
  char buf [65536];
  
  kstr.s = (char *)0x0;
  sStack_110b0 = 0;
  kstr.l = 0;
  kstr.m = 0;
  if (fd->index != (cram_index *)0x0) {
    return 0;
  }
  fd->index_sz = 1;
  pcStack_11088 = (cram_index *)calloc(1,0x30);
  fd->index = pcStack_11088;
  if (pcStack_11088 == (cram_index *)0x0) {
    return -1;
  }
  pcStack_11088->refid = -1;
  pcStack_11088->start = -0x80000000;
  pcStack_11088->end = 0x7fffffff;
  puStack_110b8 = (undefined8 *)calloc(1,8);
  *puStack_110b8 = pcStack_11088;
  sprintf(fn2,"%s.crai",fn);
  fp = hopen(fn2,"r");
  if (fp != (hFILE *)0x0) {
    pcStack_11040 = fd;
    do {
      uVar14 = (long)fp->end - (long)fp->begin;
      __n = 0x10000;
      if (uVar14 < 0x10000) {
        __n = uVar14;
      }
      memcpy(buf,fp->begin,__n);
      fp->begin = fp->begin + __n;
      sVar9 = 0x10000;
      if (uVar14 < 0x10000) {
        sVar9 = hread2(fp,buf,0x10000,__n);
        sVar15 = kstr.l;
        if (sVar9 < 1) goto LAB_00122d8d;
      }
      kputsn(buf,(int)sVar9,&kstr);
    } while( true );
  }
  perror(fn2);
LAB_00123176:
  free(puStack_110b8);
  return -1;
LAB_00122d8d:
  if (kstr.l < 2 || sVar9 != 0) {
    free(kstr.s);
    free(puStack_110b8);
    return -1;
  }
  iVar5 = hclose(fp);
  pcVar17 = kstr.s;
  if (iVar5 == 0) {
    if ((*kstr.s == '\x1f') && (kstr.s[1] == -0x75)) {
      pcVar10 = zlib_mem_inflate(kstr.s,sVar15,&l);
      free(pcVar17);
      if (pcVar10 == (char *)0x0) goto LAB_00123176;
      kstr.l = l;
      kstr.m = l;
      kstr.s = pcVar10;
      kputsn("",0,&kstr);
    }
    iVar19 = 0;
    iVar5 = 1;
    while( true ) {
      iVar6 = kget_int32(&kstr,&sStack_110b0,(int32_t *)&uStack_11068);
      if ((iVar6 == -1) || (iVar6 = kget_int32(&kstr,&sStack_110b0,&iStack_11064), iVar6 == -1))
      break;
      iVar6 = kget_int32(&kstr,&sStack_110b0,&iStack_11060);
      pcVar17 = kstr.s;
      if (iVar6 == -1) goto LAB_0012316e;
      pcVar10 = kstr.s + sStack_110b0;
      sVar15 = sStack_110b0;
      while( true ) {
        if (kstr.l <= sVar15) goto LAB_0012316e;
        cVar1 = kstr.s[sVar15];
        if ((cVar1 != ' ') && (cVar1 != '\t')) break;
        sVar15 = sVar15 + 1;
        pcVar10 = pcVar10 + 1;
      }
      uVar18 = (ulong)(cVar1 == '-');
      uVar14 = uVar18 + sVar15;
      if ((kstr.l <= uVar14) || (9 < (byte)(kstr.s[sVar15 + uVar18] - 0x30U))) goto LAB_0012316e;
      lVar16 = 0;
      for (pbVar13 = (byte *)(pcVar10 + uVar18);
          (sStack_110b0 = kstr.l, uVar14 < kstr.l &&
          (sStack_110b0 = uVar14, (byte)(*pbVar13 - 0x30) < 10)); pbVar13 = pbVar13 + 1) {
        uVar14 = uVar14 + 1;
        lVar16 = lVar16 * 10 + (ulong)*pbVar13 + -0x30;
      }
      lStack_11050 = -lVar16;
      if (cVar1 != '-') {
        lStack_11050 = lVar16;
      }
      iVar6 = kget_int32(&kstr,&sStack_110b0,(int32_t *)&uStack_11058);
      if ((iVar6 == -1) ||
         (iVar7 = kget_int32(&kstr,&sStack_110b0,(int32_t *)((long)&uStack_11058 + 4)),
         pcVar4 = pcStack_11040, iVar6 = iStack_11064, uVar3 = uStack_11068, iVar7 == -1))
      goto LAB_0012316e;
      iVar7 = iStack_11060 + iStack_11064 + -1;
      lVar16 = (long)(int)uStack_11068;
      iStack_11060 = iVar7;
      if (lVar16 < -1) {
        free(pcVar17);
        free(puStack_110b8);
        fprintf(_stderr,"Malformed index file, refid %d\n",(ulong)uStack_11068);
        return -1;
      }
      if (uStack_11068 != pcStack_11088->refid) {
        iVar19 = pcStack_11040->index_sz;
        uVar8 = uStack_11068 + 2;
        pcVar11 = pcStack_11040->index;
        if (iVar19 < (int)uVar8) {
          lStack_11048 = (long)iVar19 * 0x30;
          pcStack_11040->index_sz = uVar8;
          pcVar11 = (cram_index *)realloc(pcVar11,(ulong)uVar8 * 0x30);
          pcVar4->index = pcVar11;
          memset((void *)((long)&pcVar11->nslice + lStack_11048),0,
                 ((long)pcVar4->index_sz - (long)iVar19) * 0x30);
        }
        pcStack_11088 = pcVar11 + lVar16 + 1;
        pcVar11[lVar16 + 1].refid = uVar3;
        pcVar11[lVar16 + 1].start = -0x80000000;
        pcVar11[lVar16 + 1].end = 0x7fffffff;
        pcStack_11088->nslice = 0;
        pcStack_11088->nalloc = 0;
        pcVar11[lVar16 + 1].e = (cram_index *)0x0;
        *puStack_110b8 = pcStack_11088;
        iVar19 = 0;
      }
      lVar16 = (long)iVar19;
      iVar19 = iVar19 + 1;
      puVar12 = puStack_110b8 + lVar16;
      while ((puVar12 = puVar12 + -1, iVar6 < pcStack_11088->start || (pcStack_11088->end < iVar7)))
      {
        iVar19 = iVar19 + -1;
        pcStack_11088 = (cram_index *)*puVar12;
      }
      iVar6 = pcStack_11088->nalloc;
      if (iVar6 <= pcStack_11088->nslice + 1) {
        iVar7 = iVar6 * 2;
        if (iVar6 == 0) {
          iVar7 = 0x10;
        }
        pcStack_11088->nalloc = iVar7;
        pcVar11 = (cram_index *)realloc(pcStack_11088->e,(long)iVar7 * 0x30);
        pcStack_11088->e = pcVar11;
      }
      l = 0;
      uStack_11070 = 0;
      pcVar2 = pcStack_11088->e;
      iVar6 = pcStack_11088->nslice;
      pcStack_11088->nslice = iVar6 + 1;
      pcVar11 = pcVar2 + iVar6;
      pcVar11->slice = (undefined4)uStack_11058;
      pcVar11->len = uStack_11058._4_4_;
      *(long *)(&pcVar11->slice + 2) = lStack_11050;
      pcVar11 = pcVar2 + iVar6;
      pcVar11->refid = uStack_11068;
      pcVar11->start = iStack_11064;
      *(ulong *)(&pcVar11->refid + 2) = CONCAT44(uStack_1105c,iStack_11060);
      pcVar11 = pcVar2 + iVar6;
      pcVar11->nslice = 0;
      pcVar11->nalloc = 0;
      pcVar11->e = (cram_index *)0x0;
      if (iVar5 <= iVar19) {
        iVar5 = iVar5 * 2;
        puStack_110b8 = (undefined8 *)realloc(puStack_110b8,(long)iVar5 << 3);
      }
      pcStack_11088 = pcVar2 + iVar6;
      puStack_110b8[iVar19] = pcStack_11088;
      sVar15 = kstr.l;
      if (kstr.l < sStack_110b0) {
        sVar15 = sStack_110b0;
      }
      for (; (uVar14 = sVar15, sStack_110b0 < kstr.l &&
             (uVar14 = sStack_110b0, kstr.s[sStack_110b0] != '\n')); sStack_110b0 = sStack_110b0 + 1
          ) {
      }
      sStack_110b0 = uVar14 + 1;
      if (kstr.l <= sStack_110b0) {
        free(puStack_110b8);
        free(kstr.s);
        return 0;
      }
    }
    free(kstr.s);
  }
  else {
LAB_0012316e:
    free(pcVar17);
  }
  goto LAB_00123176;
}

Assistant:

int cram_index_load(cram_fd *fd, const char *fn) {
    char fn2[PATH_MAX];
    char buf[65536];
    ssize_t len;
    kstring_t kstr = {0};
    hFILE *fp;
    cram_index *idx;
    cram_index **idx_stack = NULL, *ep, e;
    int idx_stack_alloc = 0, idx_stack_ptr = 0;
    size_t pos = 0;

    /* Check if already loaded */
    if (fd->index)
	return 0;

    fd->index = calloc((fd->index_sz = 1), sizeof(*fd->index));
    if (!fd->index)
	return -1;

    idx = &fd->index[0];
    idx->refid = -1;
    idx->start = INT_MIN;
    idx->end   = INT_MAX;

    idx_stack = calloc(++idx_stack_alloc, sizeof(*idx_stack));
    idx_stack[idx_stack_ptr] = idx;

    sprintf(fn2, "%s.crai", fn);
    if (!(fp = hopen(fn2, "r"))) {
	perror(fn2);
	free(idx_stack);
	return -1; 
    }

    // Load the file into memory
    while ((len = hread(fp, buf, 65536)) > 0)
	kputsn(buf, len, &kstr);
    if (len < 0 || kstr.l < 2) {
	if (kstr.s)
	    free(kstr.s);
	free(idx_stack);
	return -1;
    }

    if (hclose(fp)) {
	if (kstr.s)
	    free(kstr.s);
	free(idx_stack);
	return -1;
    }
	

    // Uncompress if required
    if (kstr.s[0] == 31 && (uc)kstr.s[1] == 139) {
	size_t l;
	char *s = zlib_mem_inflate(kstr.s, kstr.l, &l);
	free(kstr.s);
	if (!s) {
	    free(idx_stack);
	    return -1;
	}
	kstr.s = s;
	kstr.l = l;
	kstr.m = l; // conservative estimate of the size allocated
	kputsn("", 0, &kstr); // ensure kstr.s is NUL-terminated
    }


    // Parse it line at a time
    do {
	/* 1.1 layout */
	if (kget_int32(&kstr, &pos, &e.refid) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.start) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.end) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int64(&kstr, &pos, &e.offset) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.slice) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.len) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}

	e.end += e.start-1;
	//printf("%d/%d..%d\n", e.refid, e.start, e.end);

	if (e.refid < -1) {
	    free(kstr.s);
	    free(idx_stack);
	    fprintf(stderr, "Malformed index file, refid %d\n", e.refid);
	    return -1;
	}

	if (e.refid != idx->refid) {
	    if (fd->index_sz < e.refid+2) {
		size_t index_end = fd->index_sz * sizeof(*fd->index);
		fd->index_sz = e.refid+2;
		fd->index = realloc(fd->index,
				    fd->index_sz * sizeof(*fd->index));
		memset(((char *)fd->index) + index_end, 0,
		       fd->index_sz * sizeof(*fd->index) - index_end);
	    }
	    idx = &fd->index[e.refid+1];
	    idx->refid = e.refid;
	    idx->start = INT_MIN;
	    idx->end   = INT_MAX;
	    idx->nslice = idx->nalloc = 0;
	    idx->e = NULL;
	    idx_stack[(idx_stack_ptr = 0)] = idx;
	}

	while (!(e.start >= idx->start && e.end <= idx->end)) {
	    idx = idx_stack[--idx_stack_ptr];
	}

	// Now contains, so append
	if (idx->nslice+1 >= idx->nalloc) {
	    idx->nalloc = idx->nalloc ? idx->nalloc*2 : 16;
	    idx->e = realloc(idx->e, idx->nalloc * sizeof(*idx->e));
	}

	e.nalloc = e.nslice = 0; e.e = NULL;
	*(ep = &idx->e[idx->nslice++]) = e;
	idx = ep;

	if (++idx_stack_ptr >= idx_stack_alloc) {
	    idx_stack_alloc *= 2;
	    idx_stack = realloc(idx_stack, idx_stack_alloc*sizeof(*idx_stack));
	}
	idx_stack[idx_stack_ptr] = idx;

	while (pos < kstr.l && kstr.s[pos] != '\n')
	    pos++;
	pos++;
    } while (pos < kstr.l);

    free(idx_stack);
    free(kstr.s);

    // dump_index(fd);

    return 0;
}